

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  undefined4 local_5c;
  undefined8 local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  char *local_38;
  
  if (argc == 1) {
LAB_001096c9:
    print_help();
LAB_001096da:
    exit(0);
  }
  pcVar3 = argv[1];
  cVar1 = *pcVar3;
  if (cVar1 == '-') {
    if (((pcVar3[1] != 'h') || (pcVar3[2] != '\0')) &&
       (iVar10 = strcmp(pcVar3,"--help"), iVar10 != 0)) {
      if ((pcVar3[1] != 'v') || (pcVar3[2] != '\0')) goto LAB_001086e4;
LAB_001096d5:
      print_version();
      goto LAB_001096da;
    }
    goto LAB_001096c9;
  }
  iVar10 = strcmp(pcVar3,"--help");
  if (iVar10 == 0) goto LAB_001096c9;
LAB_001086e4:
  iVar10 = strcmp(pcVar3,"--version");
  if (iVar10 == 0) goto LAB_001096d5;
  if (((argc < 3 || cVar1 != '-') || (pcVar3[1] != 'D')) || (pcVar3[2] != '\0')) {
    iVar10 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
    lVar16 = 1;
    if (iVar10 == 0) goto LAB_0010873d;
    goto LAB_001096e6;
  }
  coda_set_definition_path(argv[2]);
  lVar16 = 3;
LAB_0010873d:
  iVar14 = (int)lVar16;
  pcVar3 = argv[lVar16];
  iVar10 = strcmp(pcVar3,"list");
  if (iVar10 == 0) {
    iVar10 = 0;
    run_mode = RUN_MODE_LIST;
    uVar15 = iVar14 + 1;
    traverse_info.file_name = (char *)0x0;
    traverse_info.filter[0] = (codadump_filter *)0x0;
    verbosity = 1;
    calc_dim = 0;
    show_dim_vals = 0;
    show_type = 0;
    show_unit = 0;
    show_description = 0;
    iVar14 = argc - uVar15;
    if (iVar14 != 0 && (int)uVar15 <= argc) {
      local_58 = 1;
      bVar6 = true;
LAB_00108a7e:
      pcVar3 = argv[(ulong)uVar15 + (long)iVar10];
      cVar1 = *pcVar3;
      if (cVar1 == '-') {
        cVar2 = pcVar3[1];
        if (cVar2 == 'c') {
          if (pcVar3[2] != '\0') goto LAB_00108aa8;
        }
        else {
          iVar11 = strcmp(pcVar3,"--calc_dim");
          if (iVar11 != 0) {
            if (cVar2 != 'd') {
              iVar11 = strcmp(pcVar3,"--disable_conversions");
              if (iVar11 == 0) goto LAB_00108c1c;
              if ((cVar2 != 'f') || (pcVar3[2] != '\0')) goto LAB_00108ad6;
              goto LAB_00108ae9;
            }
            if (pcVar3[2] != '\0') goto LAB_00108abf;
            goto LAB_00108c1c;
          }
        }
LAB_00108be0:
        calc_dim = 1;
        pcVar3 = traverse_info.file_name;
      }
      else {
LAB_00108aa8:
        iVar11 = strcmp(pcVar3,"--calc_dim");
        if (iVar11 == 0) goto LAB_00108be0;
LAB_00108abf:
        iVar11 = strcmp(pcVar3,"--disable_conversions");
        if (iVar11 == 0) {
LAB_00108c1c:
          local_58 = 0;
          pcVar3 = traverse_info.file_name;
        }
        else {
LAB_00108ad6:
          iVar11 = strcmp(pcVar3,"--filter");
          if (iVar11 == 0) {
LAB_00108ae9:
            iVar11 = iVar10 + 1;
            if ((iVar11 < iVar14) && (*argv[(ulong)uVar15 + (long)iVar11] != '-')) {
              traverse_info.filter[0] = codadump_filter_create(argv[(ulong)uVar15 + (long)iVar11]);
              pcVar3 = traverse_info.file_name;
              iVar10 = iVar11;
              if (traverse_info.filter[0] != (codadump_filter *)0x0) goto LAB_00108ca9;
              goto LAB_00109709;
            }
          }
          if (cVar1 == '-') {
            cVar2 = pcVar3[1];
            if (cVar2 == 't') {
              if (pcVar3[2] != '\0') goto LAB_00108b21;
            }
            else {
              iVar11 = strcmp(pcVar3,"--type");
              if (iVar11 != 0) {
                if ((cVar2 != 'u') || (pcVar3[2] != '\0')) goto LAB_00108b38;
                goto LAB_00108c51;
              }
            }
          }
          else {
LAB_00108b21:
            iVar11 = strcmp(pcVar3,"--type");
            if (iVar11 != 0) {
LAB_00108b38:
              iVar11 = strcmp(pcVar3,"--unit");
              if (iVar11 == 0) {
LAB_00108c51:
                show_unit = 1;
                pcVar3 = traverse_info.file_name;
              }
              else {
                iVar11 = strcmp(pcVar3,"--description");
                if (iVar11 == 0) {
                  show_description = 1;
                  pcVar3 = traverse_info.file_name;
                }
                else {
                  iVar11 = strcmp(pcVar3,"--dim_values");
                  if (iVar11 == 0) {
                    calc_dim = 1;
                    show_dim_vals = 1;
                    pcVar3 = traverse_info.file_name;
                  }
                  else {
                    iVar11 = strcmp(pcVar3,"--no_special_types");
                    if (iVar11 == 0) {
                      bVar6 = false;
                      pcVar3 = traverse_info.file_name;
                      goto LAB_00108ca9;
                    }
                    if ((iVar10 != iVar14 + -1) || (iVar10 = iVar14 + -1, cVar1 == '-'))
                    goto LAB_00109713;
                  }
                }
              }
              goto LAB_00108ca9;
            }
          }
          show_type = 1;
          pcVar3 = traverse_info.file_name;
        }
      }
LAB_00108ca9:
      traverse_info.file_name = pcVar3;
      iVar10 = iVar10 + 1;
      if (iVar14 <= iVar10) goto code_r0x00108cb3;
      goto LAB_00108a7e;
    }
    goto LAB_001096e1;
  }
  iVar10 = strcmp(pcVar3,"ascii");
  if (iVar10 == 0) {
    run_mode = RUN_MODE_ASCII;
    uVar15 = iVar14 + 1;
    iVar14 = 0;
    traverse_info.file_name = (char *)0x0;
    traverse_info.filter[0] = (codadump_filter *)0x0;
    output_file_name = (char *)0x0;
    ascii_col_sep = " ";
    ascii_output = _stdout;
    verbosity = 1;
    local_58 = 1;
    calc_dim = 1;
    show_index = 0;
    show_label = 0;
    show_quotes = 0;
    show_time_as_string = 0;
    iVar10 = argc - uVar15;
    if (iVar10 != 0 && (int)uVar15 <= argc) {
      bVar6 = true;
LAB_00108d9e:
      pcVar3 = argv[(ulong)uVar15 + (long)iVar14];
      cVar1 = *pcVar3;
      if (cVar1 == '-') {
        cVar2 = pcVar3[1];
        if (cVar2 == 'd') {
          if (pcVar3[2] != '\0') goto LAB_00108dc8;
        }
        else {
          iVar11 = strcmp(pcVar3,"--disable_conversions");
          if (iVar11 != 0) {
            if ((cVar2 != 'f') || (pcVar3[2] != '\0')) goto LAB_00108ddf;
            goto LAB_00108df2;
          }
        }
LAB_00108f7b:
        local_58 = 0;
        pcVar7 = traverse_info.file_name;
        pcVar8 = ascii_col_sep;
        pcVar9 = output_file_name;
        iVar11 = iVar14;
      }
      else {
LAB_00108dc8:
        iVar11 = strcmp(pcVar3,"--disable_conversions");
        if (iVar11 == 0) goto LAB_00108f7b;
LAB_00108ddf:
        iVar11 = strcmp(pcVar3,"--filter");
        if (iVar11 == 0) {
LAB_00108df2:
          iVar11 = iVar14 + 1;
          if ((iVar10 <= iVar11) || (*argv[(ulong)uVar15 + (long)iVar11] == '-')) goto LAB_00108e0a;
          traverse_info.filter[0] = codadump_filter_create(argv[(ulong)uVar15 + (long)iVar11]);
          pcVar7 = traverse_info.file_name;
          pcVar8 = ascii_col_sep;
          pcVar9 = output_file_name;
          if (traverse_info.filter[0] == (codadump_filter *)0x0) goto LAB_00109704;
        }
        else {
LAB_00108e0a:
          if (cVar1 == '-') {
            cVar2 = pcVar3[1];
            if (cVar2 == 'i') {
              if (pcVar3[2] != '\0') goto LAB_00108e29;
            }
            else {
              iVar11 = strcmp(pcVar3,"--index");
              if (iVar11 != 0) {
                if (cVar2 != 'l') {
                  iVar11 = strcmp(pcVar3,"--label");
                  if (iVar11 == 0) goto LAB_00109007;
                  if ((cVar2 != 'o') || (pcVar3[2] != '\0')) goto LAB_00108e57;
                  goto LAB_00108e6a;
                }
                if (pcVar3[2] != '\0') goto LAB_00108e40;
                goto LAB_00109007;
              }
            }
          }
          else {
LAB_00108e29:
            iVar11 = strcmp(pcVar3,"--index");
            if (iVar11 != 0) {
LAB_00108e40:
              iVar11 = strcmp(pcVar3,"--label");
              if (iVar11 == 0) {
LAB_00109007:
                show_label = 1;
                pcVar7 = traverse_info.file_name;
                pcVar8 = ascii_col_sep;
                pcVar9 = output_file_name;
                iVar11 = iVar14;
                goto LAB_00109075;
              }
LAB_00108e57:
              iVar11 = strcmp(pcVar3,"--output");
              if (iVar11 == 0) {
LAB_00108e6a:
                iVar11 = iVar14 + 1;
                if ((iVar11 < iVar10) &&
                   (pcVar7 = traverse_info.file_name, pcVar8 = ascii_col_sep,
                   pcVar9 = argv[(ulong)uVar15 + (long)iVar11],
                   *argv[(ulong)uVar15 + (long)iVar11] != '-')) goto LAB_00109075;
              }
              if (cVar1 == '-') {
                cVar2 = pcVar3[1];
                if (cVar2 == 'q') {
                  if (pcVar3[2] != '\0') goto LAB_00108ea1;
                }
                else {
                  iVar11 = strcmp(pcVar3,"--quote_strings");
                  if (iVar11 != 0) {
                    if ((cVar2 != 's') || (pcVar3[2] != '\0')) goto LAB_00108eb8;
                    goto LAB_00108ecb;
                  }
                }
              }
              else {
LAB_00108ea1:
                iVar11 = strcmp(pcVar3,"--quote_strings");
                if (iVar11 != 0) {
LAB_00108eb8:
                  iVar11 = strcmp(pcVar3,"--column_separator");
                  if (iVar11 == 0) {
LAB_00108ecb:
                    iVar11 = iVar14 + 1;
                    if ((iVar11 < iVar10) &&
                       (pcVar7 = traverse_info.file_name,
                       pcVar8 = argv[(ulong)uVar15 + (long)iVar11], pcVar9 = output_file_name,
                       *argv[(ulong)uVar15 + (long)iVar11] != '-')) goto LAB_00109075;
                  }
                  if (((cVar1 == '-') && ((pcVar3[1] == 't' && (pcVar3[2] == '\0')))) ||
                     (iVar11 = strcmp(pcVar3,"--time_as_string"), iVar11 == 0)) {
                    show_time_as_string = 1;
                    pcVar7 = traverse_info.file_name;
                    pcVar8 = ascii_col_sep;
                    pcVar9 = output_file_name;
                    iVar11 = iVar14;
                  }
                  else {
                    iVar11 = strcmp(pcVar3,"--no_special_types");
                    pcVar8 = ascii_col_sep;
                    pcVar9 = output_file_name;
                    if (iVar11 != 0) {
                      if ((iVar14 == iVar10 + -1) &&
                         (pcVar7 = pcVar3, iVar11 = iVar10 + -1, cVar1 != '-')) goto LAB_00109075;
                      goto LAB_00109722;
                    }
                    bVar6 = false;
                    pcVar7 = traverse_info.file_name;
                    iVar11 = iVar14;
                  }
                  goto LAB_00109075;
                }
              }
              show_quotes = 1;
              pcVar7 = traverse_info.file_name;
              pcVar8 = ascii_col_sep;
              pcVar9 = output_file_name;
              iVar11 = iVar14;
              goto LAB_00109075;
            }
          }
          show_index = 1;
          pcVar7 = traverse_info.file_name;
          pcVar8 = ascii_col_sep;
          pcVar9 = output_file_name;
          iVar11 = iVar14;
        }
      }
LAB_00109075:
      output_file_name = pcVar9;
      ascii_col_sep = pcVar8;
      traverse_info.file_name = pcVar7;
      iVar14 = iVar11 + 1;
      if (iVar10 <= iVar14) goto code_r0x00109081;
      goto LAB_00108d9e;
    }
    goto LAB_001096f0;
  }
  iVar10 = strcmp(pcVar3,"json");
  if (iVar10 != 0) {
    iVar10 = strcmp(pcVar3,"yaml");
    if (iVar10 != 0) {
      iVar10 = strcmp(pcVar3,"debug");
      if (iVar10 != 0) goto LAB_00109727;
      run_mode = RUN_MODE_DEBUG;
      uVar15 = iVar14 + 1;
      iVar14 = 0;
      traverse_info.file_name = (char *)0x0;
      output_file_name = (char *)0x0;
      starting_path = (char *)0x0;
      ascii_output = _stdout;
      iVar10 = argc - uVar15;
      if (iVar10 == 0 || argc < (int)uVar15) {
LAB_001096fa:
        main_cold_6();
        goto LAB_001096ff;
      }
      local_5c = 1;
      local_48 = (char *)0x0;
      local_4c = 0;
      local_38 = (char *)0x0;
      local_40 = (char *)0x0;
      do {
        lVar16 = (long)iVar14;
        pcVar3 = argv[(ulong)uVar15 + lVar16];
        cVar1 = *pcVar3;
        if (cVar1 == '-') {
          cVar2 = pcVar3[1];
          if (cVar2 == 'd') {
            if (pcVar3[2] != '\0') goto LAB_0010885f;
          }
          else {
            iVar11 = strcmp(pcVar3,"--disable_fast_size_expressions");
            if (iVar11 != 0) {
              if ((cVar2 != 'o') || (pcVar3[2] != '\0')) goto LAB_00108876;
              goto LAB_00108889;
            }
          }
LAB_001089c6:
          local_5c = 0;
          iVar11 = iVar14;
          pcVar7 = traverse_info.file_name;
          pcVar8 = output_file_name;
          pcVar9 = starting_path;
        }
        else {
LAB_0010885f:
          iVar11 = strcmp(pcVar3,"--disable_fast_size_expressions");
          if (iVar11 == 0) goto LAB_001089c6;
LAB_00108876:
          iVar11 = strcmp(pcVar3,"--output");
          if (iVar11 == 0) {
LAB_00108889:
            iVar11 = iVar14 + 1;
            if ((iVar10 <= iVar11) ||
               (pcVar7 = traverse_info.file_name, pcVar8 = argv[(ulong)uVar15 + (long)iVar11],
               pcVar9 = starting_path, *argv[(ulong)uVar15 + (long)iVar11] == '-'))
            goto LAB_001088a7;
          }
          else {
LAB_001088a7:
            if ((((cVar1 != '-') || ((pcVar3[1] != 'p' || (pcVar3[2] != '\0')))) &&
                (iVar11 = strcmp(pcVar3,"--path"), iVar11 != 0)) ||
               ((iVar11 = iVar14 + 1, iVar10 <= iVar11 ||
                (pcVar7 = traverse_info.file_name, pcVar8 = output_file_name,
                pcVar9 = argv[(ulong)uVar15 + (long)iVar11],
                *argv[(ulong)uVar15 + (long)iVar11] == '-')))) {
              iVar11 = strcmp(pcVar3,"--max_depth");
              if ((iVar11 == 0) &&
                 ((iVar11 = iVar14 + 1, iVar11 < iVar10 &&
                  (*argv[(ulong)uVar15 + (long)iVar11] != '-')))) {
                max_depth = atoi(argv[(ulong)uVar15 + (long)iVar11]);
                pcVar7 = traverse_info.file_name;
                pcVar8 = output_file_name;
                pcVar9 = starting_path;
              }
              else {
                iVar11 = strcmp(pcVar3,"--open_as");
                if ((iVar11 == 0) &&
                   ((((iVar11 = iVar14 + 3, iVar11 < iVar10 &&
                      (pcVar4 = argv[(ulong)uVar15 + lVar16 + 1], *pcVar4 != '-')) &&
                     (pcVar5 = argv[(ulong)uVar15 + lVar16 + 2], *pcVar5 != '-')) &&
                    (*argv[(ulong)uVar15 + (long)iVar11] != '-')))) {
                  local_4c = atoi(argv[(ulong)uVar15 + (long)iVar11]);
                  pcVar7 = traverse_info.file_name;
                  pcVar8 = output_file_name;
                  pcVar9 = starting_path;
                  local_40 = pcVar4;
                  local_38 = pcVar5;
                }
                else if ((iVar14 != iVar10 + -1) ||
                        (iVar11 = iVar10 + -1, pcVar7 = pcVar3, pcVar8 = output_file_name,
                        pcVar9 = starting_path, local_48 = pcVar3, cVar1 == '-')) {
                  main_cold_3();
                  goto LAB_001096d5;
                }
              }
            }
          }
        }
        starting_path = pcVar9;
        output_file_name = pcVar8;
        traverse_info.file_name = pcVar7;
        iVar14 = iVar11 + 1;
      } while (iVar14 < iVar10);
      if ((local_48 == (char *)0x0) || (*local_48 == '\0')) goto LAB_001096fa;
      iVar10 = coda_init();
      if (iVar10 != 0) goto LAB_0010972c;
      coda_set_option_perform_conversions(0);
      coda_set_option_use_fast_size_expressions(local_5c);
      if ((output_file_name == (char *)0x0) ||
         (ascii_output = (FILE *)fopen(output_file_name,"w"), (FILE *)ascii_output != (FILE *)0x0))
      {
        print_debug_data(local_40,local_38,local_4c);
        goto LAB_0010969d;
      }
      goto LAB_0010973b;
    }
    run_mode = RUN_MODE_YAML;
    uVar15 = iVar14 + 1;
    iVar14 = 0;
    traverse_info.file_name = (char *)0x0;
    output_file_name = (char *)0x0;
    starting_path = (char *)0x0;
    ascii_output = _stdout;
    iVar10 = argc - uVar15;
    if (iVar10 == 0 || argc < (int)uVar15) goto LAB_00109718;
    local_5c = 1;
    local_48 = (char *)0x0;
    iVar11 = 0;
    bVar6 = true;
    do {
      pcVar3 = argv[(ulong)uVar15 + (long)iVar14];
      cVar1 = *pcVar3;
      iVar13 = iVar14;
      if (cVar1 == '-') {
        cVar2 = pcVar3[1];
        if (cVar2 == 'a') {
          if (pcVar3[2] != '\0') goto LAB_001094be;
        }
        else {
          iVar12 = strcmp(pcVar3,"--attributes");
          if (iVar12 != 0) {
            if (cVar2 != 'd') {
              iVar12 = strcmp(pcVar3,"--disable_conversions");
              if (iVar12 == 0) goto LAB_001095fc;
              if ((cVar2 != 'o') || (pcVar3[2] != '\0')) goto LAB_001094ec;
              goto LAB_001094ff;
            }
            if (pcVar3[2] != '\0') goto LAB_001094d5;
            goto LAB_001095fc;
          }
        }
LAB_001095bb:
        iVar11 = 1;
        pcVar7 = traverse_info.file_name;
        pcVar8 = output_file_name;
        pcVar9 = starting_path;
      }
      else {
LAB_001094be:
        iVar12 = strcmp(pcVar3,"--attributes");
        if (iVar12 == 0) goto LAB_001095bb;
LAB_001094d5:
        iVar12 = strcmp(pcVar3,"--disable_conversions");
        if (iVar12 == 0) {
LAB_001095fc:
          local_5c = 0;
          pcVar7 = traverse_info.file_name;
          pcVar8 = output_file_name;
          pcVar9 = starting_path;
        }
        else {
LAB_001094ec:
          iVar13 = strcmp(pcVar3,"--output");
          if (iVar13 == 0) {
LAB_001094ff:
            iVar13 = iVar14 + 1;
            if ((iVar13 < iVar10) &&
               (pcVar7 = traverse_info.file_name, pcVar8 = argv[(ulong)uVar15 + (long)iVar13],
               pcVar9 = starting_path, *argv[(ulong)uVar15 + (long)iVar13] != '-'))
            goto LAB_00109604;
          }
          if ((((cVar1 != '-') || ((pcVar3[1] != 'p' || (pcVar3[2] != '\0')))) &&
              (iVar13 = strcmp(pcVar3,"--path"), iVar13 != 0)) ||
             ((iVar13 = iVar14 + 1, iVar10 <= iVar13 ||
              (pcVar7 = traverse_info.file_name, pcVar8 = output_file_name,
              pcVar9 = argv[(ulong)uVar15 + (long)iVar13],
              *argv[(ulong)uVar15 + (long)iVar13] == '-')))) {
            iVar13 = strcmp(pcVar3,"--no_special_types");
            pcVar8 = output_file_name;
            pcVar9 = starting_path;
            if (iVar13 == 0) {
              bVar6 = false;
              pcVar7 = traverse_info.file_name;
              iVar13 = iVar14;
            }
            else if ((iVar14 != iVar10 + -1) ||
                    (pcVar7 = pcVar3, local_48 = pcVar3, iVar13 = iVar10 + -1, cVar1 == '-'))
            goto LAB_001096f5;
          }
        }
      }
LAB_00109604:
      starting_path = pcVar9;
      output_file_name = pcVar8;
      traverse_info.file_name = pcVar7;
      iVar14 = iVar13 + 1;
    } while (iVar14 < iVar10);
    if ((local_48 == (char *)0x0) || (*local_48 == '\0')) goto LAB_00109718;
    iVar10 = coda_init();
    if (iVar10 == 0) {
      coda_set_option_bypass_special_types(!bVar6);
      coda_set_option_perform_conversions(local_5c);
      if ((output_file_name != (char *)0x0) &&
         (ascii_output = (FILE *)fopen(output_file_name,"w"), (FILE *)ascii_output == (FILE *)0x0))
      goto LAB_0010974a;
      print_yaml_data(iVar11);
      goto LAB_0010969d;
    }
    goto LAB_00109740;
  }
  run_mode = RUN_MODE_JSON;
  uVar15 = iVar14 + 1;
  iVar14 = 0;
  traverse_info.file_name = (char *)0x0;
  output_file_name = (char *)0x0;
  starting_path = (char *)0x0;
  ascii_output = _stdout;
  iVar10 = argc - uVar15;
  if (iVar10 == 0 || argc < (int)uVar15) {
LAB_001096ff:
    main_cold_14();
LAB_00109704:
    main_cold_15();
LAB_00109709:
    main_cold_20();
    goto LAB_0010970e;
  }
  local_5c = 1;
  local_48 = (char *)0x0;
  iVar11 = 0;
  bVar6 = true;
  do {
    pcVar3 = argv[(ulong)uVar15 + (long)iVar14];
    cVar1 = *pcVar3;
    iVar13 = iVar14;
    if (cVar1 == '-') {
      cVar2 = pcVar3[1];
      if (cVar2 == 'a') {
        if (pcVar3[2] != '\0') goto LAB_00109231;
      }
      else {
        iVar12 = strcmp(pcVar3,"--attributes");
        if (iVar12 != 0) {
          if (cVar2 != 'd') {
            iVar12 = strcmp(pcVar3,"--disable_conversions");
            if (iVar12 == 0) goto LAB_0010936f;
            if ((cVar2 != 'o') || (pcVar3[2] != '\0')) goto LAB_0010925f;
            goto LAB_00109272;
          }
          if (pcVar3[2] != '\0') goto LAB_00109248;
          goto LAB_0010936f;
        }
      }
LAB_0010932e:
      iVar11 = 1;
      pcVar7 = traverse_info.file_name;
      pcVar8 = output_file_name;
      pcVar9 = starting_path;
    }
    else {
LAB_00109231:
      iVar12 = strcmp(pcVar3,"--attributes");
      if (iVar12 == 0) goto LAB_0010932e;
LAB_00109248:
      iVar12 = strcmp(pcVar3,"--disable_conversions");
      if (iVar12 == 0) {
LAB_0010936f:
        local_5c = 0;
        pcVar7 = traverse_info.file_name;
        pcVar8 = output_file_name;
        pcVar9 = starting_path;
      }
      else {
LAB_0010925f:
        iVar13 = strcmp(pcVar3,"--output");
        if (iVar13 == 0) {
LAB_00109272:
          iVar13 = iVar14 + 1;
          if ((iVar13 < iVar10) &&
             (pcVar7 = traverse_info.file_name, pcVar8 = argv[(ulong)uVar15 + (long)iVar13],
             pcVar9 = starting_path, *argv[(ulong)uVar15 + (long)iVar13] != '-')) goto LAB_00109377;
        }
        if ((((cVar1 != '-') || ((pcVar3[1] != 'p' || (pcVar3[2] != '\0')))) &&
            (iVar13 = strcmp(pcVar3,"--path"), iVar13 != 0)) ||
           ((iVar13 = iVar14 + 1, iVar10 <= iVar13 ||
            (pcVar7 = traverse_info.file_name, pcVar8 = output_file_name,
            pcVar9 = argv[(ulong)uVar15 + (long)iVar13], *argv[(ulong)uVar15 + (long)iVar13] == '-')
            ))) {
          iVar13 = strcmp(pcVar3,"--no_special_types");
          pcVar8 = output_file_name;
          pcVar9 = starting_path;
          if (iVar13 == 0) {
            bVar6 = false;
            pcVar7 = traverse_info.file_name;
            iVar13 = iVar14;
          }
          else if ((iVar14 != iVar10 + -1) ||
                  (pcVar7 = pcVar3, local_48 = pcVar3, iVar13 = iVar10 + -1, cVar1 == '-'))
          goto LAB_001096eb;
        }
      }
    }
LAB_00109377:
    starting_path = pcVar9;
    output_file_name = pcVar8;
    traverse_info.file_name = pcVar7;
    iVar14 = iVar13 + 1;
  } while (iVar14 < iVar10);
  if ((local_48 == (char *)0x0) || (*local_48 == '\0')) goto LAB_001096ff;
  iVar10 = coda_init();
  if (iVar10 != 0) goto LAB_00109736;
  coda_set_option_bypass_special_types(!bVar6);
  coda_set_option_perform_conversions(local_5c);
  if ((output_file_name == (char *)0x0) ||
     (ascii_output = (FILE *)fopen(output_file_name,"w"), (FILE *)ascii_output != (FILE *)0x0)) {
    print_json_data(iVar11);
LAB_0010969d:
    if (output_file_name != (char *)0x0) {
      fclose((FILE *)ascii_output);
    }
LAB_001096b3:
    coda_done();
    return 0;
  }
  goto LAB_00109745;
code_r0x00108cb3:
  if ((traverse_info.file_name == (char *)0x0) || (*traverse_info.file_name == '\0')) {
LAB_001096e1:
    main_cold_23();
LAB_001096e6:
    main_cold_1();
LAB_001096eb:
    main_cold_11();
    goto LAB_001096f0;
  }
  iVar10 = coda_init();
  if (iVar10 == 0) {
    coda_set_option_bypass_special_types(!bVar6);
    coda_set_option_perform_boundary_checks(0);
    coda_set_option_perform_conversions(local_58);
    traverse_info_init();
    dim_info_init();
    traverse_product();
LAB_00109119:
    dim_info_done();
    traverse_info_done();
    goto LAB_001096b3;
  }
LAB_0010970e:
  main_cold_22();
LAB_00109713:
  main_cold_21();
LAB_00109718:
  main_cold_10();
LAB_0010971d:
  main_cold_17();
LAB_00109722:
  main_cold_16();
LAB_00109727:
  main_cold_2();
LAB_0010972c:
  main_cold_4();
  goto LAB_00109731;
code_r0x00109081:
  if ((traverse_info.file_name == (char *)0x0) || (*traverse_info.file_name == '\0')) {
LAB_001096f0:
    main_cold_19();
LAB_001096f5:
    main_cold_7();
    goto LAB_001096fa;
  }
  iVar10 = coda_init();
  if (iVar10 != 0) goto LAB_0010971d;
  coda_set_option_bypass_special_types(!bVar6);
  coda_set_option_perform_boundary_checks(0);
  coda_set_option_perform_conversions(local_58);
  traverse_info_init();
  dim_info_init();
  if ((output_file_name == (char *)0x0) ||
     (ascii_output = (FILE *)fopen(output_file_name,"w"), (FILE *)ascii_output != (FILE *)0x0)) {
    traverse_product();
    if (output_file_name != (char *)0x0) {
      fclose((FILE *)ascii_output);
    }
    goto LAB_00109119;
  }
LAB_00109731:
  main_cold_18();
LAB_00109736:
  main_cold_12();
LAB_0010973b:
  main_cold_5();
LAB_00109740:
  main_cold_8();
LAB_00109745:
  main_cold_13();
LAB_0010974a:
  main_cold_9();
  puts("Usage:");
  puts("    codadump [-D definitionpath] list [<list options>] <product file>");
  puts("        List the contents of a product file");
  puts("        List options:");
  puts("            -c, --calc_dim");
  puts("                    calculate dimensions of all arrays");
  puts("            -d, --disable_conversions");
  puts("                    do not perform unit/value conversions");
  puts("            -f, --filter \'<filter expression>\'");
  puts("                    restrict the output to data that matches the filter");
  puts("            -t, --type");
  puts("                    show basic data type");
  puts("            -u, --unit");
  puts("                    show unit information");
  puts("            --description");
  puts("                    show description information");
  puts("            --dim_values");
  puts("                    show all possible values for a variable sized dim");
  puts("                    (implies --calc_dim)");
  puts("            --no_special_types");
  puts("                    bypass special data types from the CODA format definition -");
  puts("                    data with a special type is treated using its non-special");
  puts("                    base type");
  putchar(10);
  puts("    codadump [-D definitionpath] ascii [<ascii options>] <product file>");
  puts("        Show the contents of a product file in ascii format");
  puts("        List options:");
  puts("            -d, --disable_conversions");
  puts("                    do not perform unit/value conversions");
  puts("            -f, --filter \'<filter expression>\'");
  puts("                    restrict the output to data that matches the filter");
  puts("            -i, --index");
  puts("                    print the array index for each array element");
  puts("            -l, --label");
  puts("                    print the full name and array dims for each data block");
  puts("            -o, --output <filename>");
  puts("                    write output to specified file");
  puts("            -q, --quote_strings");
  puts("                    put \"\" around string data and \'\' around character data");
  puts("            -s, --column_separator \'<separator string>\'");
  puts("                    use the given string as column separator (default: \' \')");
  puts("            -t, --time_as_string");
  puts("                    print time as a string (instead of a floating point value)");
  puts("            --no_special_types");
  puts("                    bypass special data types from the CODA format definition -");
  puts("                    data with a special type is treated using its non-special");
  puts("                    base type");
  putchar(10);
  puts("    codadump [-D definitionpath] json [<json options>] <product file>");
  puts("        Write the contents of a product file to a JSON file");
  puts("        JSON options:");
  puts("            -a, --attributes");
  puts("                    include attributes - items with attributes will be");
  puts("                    encapsulated in a {\'attr\':<attr>,\'data\':<data>} object");
  puts("            -d, --disable_conversions");
  puts("                    do not perform unit/value conversions");
  puts("            -o, --output <filename>");
  puts("                    write output to specified file");
  puts("            -p, --path <path>");
  puts("                    path (in the form of a CODA node expression) to the");
  puts("                    location in the product where the operation should begin");
  puts("            --no_special_types");
  puts("                    bypass special data types from the CODA format definition -");
  puts("                    data with a special type is treated using its non-special");
  puts("                    base type");
  putchar(10);
  puts("    codadump [-D definitionpath] yaml [<json options>] <product file>");
  puts("        Write the contents of a product file to a YAML file");
  puts("        YAML options:");
  puts("            -a, --attributes");
  puts("                    include attributes - items with attributes will be");
  puts("                    encapsulated in a an associative array with keys \'attr\'");
  puts("                    and \'data\'");
  puts("            -d, --disable_conversions");
  puts("                    do not perform unit/value conversions");
  puts("            -o, --output <filename>");
  puts("                    write output to specified file");
  puts("            -p, --path <path>");
  puts("                    path (in the form of a CODA node expression) to the");
  puts("                    location in the product where the operation should begin");
  puts("            --no_special_types");
  puts("                    bypass special data types from the CODA format definition -");
  puts("                    data with a special type is treated using its non-special");
  puts("                    base type");
  putchar(10);
  puts("    codadump [-D definitionpath] debug [<debug options>] <product file>");
  puts("        Show the contents of a product file in sequential order for debug");
  puts("        purposes. No conversions are applied and (if applicable) for each");
  puts("        data element the file offset is given");
  puts("        Debug options:");
  puts("            -d, --disable_fast_size_expressions");
  puts("                    do not use fast-size expressions");
  puts("            -o, --output <filename>");
  puts("                    write output to specified file");
  puts("            -p, --path <path>");
  puts("                    path (in the form of a CODA node expression) to the");
  puts("                    location in the product where the operation should begin");
  puts("            --max_depth <depth>");
  puts("                    only traverse arrays/records this deep for printing items");
  puts("                    (the max depth is relative to any path provided by -p)");
  puts("            --open_as <product class> <product type> <version>");
  puts("                    force opening the product using the given product class,");
  puts("                    product type, and format version");
  putchar(10);
  puts("    codadump -h, --help");
  puts("        Show help (this text)");
  putchar(10);
  puts("    codadump -v, --version");
  puts("        Print the version number of CODA and exit");
  putchar(10);
  puts("    CODA will look for .codadef files using a definition path, which is a \':\'");
  puts("    separated (\';\' on Windows) list of paths to .codadef files and/or to");
  puts("    directories containing .codadef files.");
  puts("    By default the definition path is set to a single directory relative to");
  puts("    the tool location. A different definition path can be set via the");
  puts("    CODA_DEFINITION environment variable or via the -D option.");
  puts("    (the -D option overrides the environment variable setting).");
  iVar10 = putchar(10);
  return iVar10;
}

Assistant:

int main(int argc, char *argv[])
{
    int i;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    if (strcmp(argv[i], "list") == 0)
    {
        run_mode = RUN_MODE_LIST;
        i++;
        handle_list_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "ascii") == 0)
    {
        run_mode = RUN_MODE_ASCII;
        i++;
        handle_ascii_run_mode(argc - i, &argv[i]);
    }
#ifdef HAVE_HDF4
    else if (strcmp(argv[i], "hdf4") == 0)
    {
        run_mode = RUN_MODE_HDF4;
        i++;
        handle_hdf4_run_mode(argc - i, &argv[i]);
    }
#endif
    else if (strcmp(argv[i], "json") == 0)
    {
        run_mode = RUN_MODE_JSON;
        i++;
        handle_json_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "yaml") == 0)
    {
        run_mode = RUN_MODE_YAML;
        i++;
        handle_yaml_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "debug") == 0)
    {
        run_mode = RUN_MODE_DEBUG;
        i++;
        handle_debug_run_mode(argc - i, &argv[i]);
    }
    else
    {
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }

    return 0;
}